

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O3

shared_ptr<ixy::Mempool> __thiscall
ixy::Mempool::allocate(Mempool *this,uint32_t num_entries,uint32_t entry_size)

{
  ulong uVar1;
  Mempool *pMVar2;
  int __fd;
  ulong uVar3;
  __off_t _Var4;
  ssize_t sVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  uint uVar7;
  uint8_t *puVar8;
  ulong uVar9;
  uint buf_size;
  dma_memory dVar10;
  shared_ptr<ixy::Mempool> sVar11;
  uintptr_t phy;
  uintptr_t addr;
  Mempool pool;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_void_*const_&>,_const_char_*>_>
  local_168;
  ulong local_148;
  uint8_t *local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  Mempool *local_120;
  ulong local_118;
  uint8_t *local_110;
  unsigned_long local_108;
  undefined1 local_100 [16];
  pointer local_f0;
  iterator local_e8;
  unsigned_long *local_e0;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  
  buf_size = 0x800;
  if (entry_size != 0) {
    buf_size = entry_size;
  }
  if ((int)(0x200000 % (ulong)buf_size) != 0) {
    local_100._8_8_ = "entry size must be a divisor of the huge page size ";
    local_f0 = (pointer)&HUGE_PAGE_SIZE;
    error<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_int_const&>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/mempool.cpp"
               ,0x10,"allocate",
               (LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>_> *)
               local_100);
  }
  dVar10 = memory_allocate_dma((ulong)(buf_size * num_entries),false);
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_88,0);
  Mempool((Mempool *)local_100,(uint8_t *)dVar10.virt,buf_size,num_entries,&local_138,
          (stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
          &local_88);
  local_120 = this;
  local_110 = (uint8_t *)dVar10.virt;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_88);
  if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (num_entries != 0) {
    uVar7 = 0;
    uVar9 = 0;
    local_118 = (ulong)num_entries;
    do {
      puVar8 = local_110 + uVar7;
      local_140 = puVar8;
      uVar3 = sysconf(0x1e);
      __fd = open("/proc/self/pagemap",0);
      if (__fd == -1) {
        local_168.list.first.first.second = "failed to open pagemap";
        error<ixy::Pair<ixy::None,char_const*>>
                  ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
                   ,0x19,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_168);
      }
      uVar3 = uVar3 & 0xffffffff;
      _Var4 = lseek(__fd,((ulong)puVar8 / uVar3) * 8,0);
      if (_Var4 == -1) {
        local_168.list.first.first.second = "failed to lseek pagemap";
        error<ixy::Pair<ixy::None,char_const*>>
                  ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
                   ,0x1e,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_168);
      }
      local_148 = 0;
      sVar5 = read(__fd,&local_148,8);
      if (sVar5 == -1) {
        local_168.list.first.first.second = "failed to translate address";
        error<ixy::Pair<ixy::None,char_const*>>
                  ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
                   ,0x23,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_168);
      }
      close(__fd);
      uVar1 = local_148;
      if (local_148 == 0) {
        local_168.list.first.first.second = "failed to translate virtual address ";
        local_168.list.first.second = &local_140;
        local_168.list.second = " to physical address";
        error<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,void*const&>,char_const*>>
                  ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
                   ,0x29,"virt_to_phys",&local_168);
        puVar8 = local_140;
      }
      local_108 = (ulong)puVar8 % uVar3 + (uVar1 & 0x7fffffffffffff) * uVar3;
      if (local_e8._M_current == local_e0) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_f0,local_e8,
                   &local_108);
      }
      else {
        *local_e8._M_current = local_108;
        local_e8._M_current = local_e8._M_current + 1;
      }
      local_168.list.first.first._0_8_ = uVar9;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                 (unsigned_long *)&local_168);
      uVar9 = uVar9 + 1;
      uVar7 = uVar7 + buf_size;
    } while (local_118 != uVar9);
  }
  pMVar2 = local_120;
  local_120->base_addr = (uint8_t *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ixy::Mempool,std::allocator<ixy::Mempool>,ixy::Mempool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_120->buf_size,
             (Mempool **)local_120,(allocator<ixy::Mempool> *)&local_168,(Mempool *)local_100);
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_d8);
  _Var6._M_pi = extraout_RDX;
  if (local_f0 != (pointer)0x0) {
    operator_delete(local_f0,(long)local_e0 - (long)local_f0);
    _Var6._M_pi = extraout_RDX_00;
  }
  sVar11.super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar11.super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pMVar2;
  return (shared_ptr<ixy::Mempool>)
         sVar11.super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto Mempool::allocate(uint32_t num_entries, uint32_t entry_size) -> std::shared_ptr<Mempool> {
    entry_size = entry_size ? entry_size : 2048;
    // require entries that neatly fit into the page size, this makes the memory pool much easier
    // otherwise our base_addr + index * size formula would be wrong because we can't cross a page-boundary
    if (HUGE_PAGE_SIZE % entry_size) {
        error("entry size must be a divisor of the huge page size " << HUGE_PAGE_SIZE);
    }

    struct dma_memory mem = memory_allocate_dma(num_entries * entry_size, false);
    auto pool = Mempool{static_cast<uint8_t *>(mem.virt), entry_size, num_entries, std::vector<uint64_t>(),
                        std::stack<uint64_t>()};

    for (uint32_t i = 0; i < num_entries; i++) {
        auto addr = virt_to_phys(static_cast<uint8_t *>(mem.virt) + (i * entry_size));
        pool.physical_addr.push_back(addr);
        pool.free_stack.push(i);
    }

    return std::make_shared<Mempool>(std::move(pool));
}